

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

void ON_RenderContentPrivate::BuildXMLHierarchy(ON_RenderContent *rc,ON_XMLNode *node)

{
  ON_RenderContent *rc_00;
  ON_XMLNode *this;
  
  ON_XMLNode::operator=(node,&rc->_private->m_node);
  for (rc_00 = rc->_private->m_first_child; rc_00 != (ON_RenderContent *)0x0;
      rc_00 = rc_00->_private->m_next_sibling) {
    this = (ON_XMLNode *)operator_new(0xe8);
    ON_XMLNode::ON_XMLNode(this,L"");
    BuildXMLHierarchy(rc_00,this);
    (*node->_vptr_ON_XMLNode[0xb])(node,this);
  }
  return;
}

Assistant:

void ON_RenderContentPrivate::BuildXMLHierarchy(const ON_RenderContent& rc, ON_XMLNode& node) // Static.
{
  // Recursively builds 'node' from the tree structure of the XML nodes in 'rc' and its children.

  node = rc._private->m_node;

  auto* child_rc = rc._private->m_first_child;
  while (nullptr != child_rc)
  {
    auto* child_node = new ON_XMLNode(L"");
    BuildXMLHierarchy(*child_rc, *child_node);
    node.AttachChildNode(child_node);

    child_rc = child_rc->_private->m_next_sibling;
  }
}